

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::expandAll(QTreeView *this)

{
  QTreeViewPrivate *this_00;
  QTreeViewPrivate *in_RDI;
  QTreeViewPrivate *d;
  bool in_stack_00000082;
  bool in_stack_00000083;
  int in_stack_00000084;
  QTreeViewPrivate *in_stack_00000088;
  QTreeViewPrivate *this_01;
  
  this_01 = in_RDI;
  this_00 = d_func((QTreeView *)0x8fe7ab);
  QList<QTreeViewItem>::clear((QList<QTreeViewItem> *)this_00);
  QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
  QTreeViewPrivate::layout(in_stack_00000088,in_stack_00000084,in_stack_00000083,in_stack_00000082);
  (**(code **)(*(long *)&(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                         super_QFramePrivate.super_QWidgetPrivate + 0x268))();
  QWidget::update((QWidget *)in_RDI);
  QTreeViewPrivate::updateAccessibility(this_01);
  return;
}

Assistant:

void QTreeView::expandAll()
{
    Q_D(QTreeView);
    d->viewItems.clear();
    d->interruptDelayedItemsLayout();
    d->layout(-1, true);
    updateGeometries();
    d->viewport->update();
    d->updateAccessibility();
}